

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O0

void absl::lts_20250127::base_internal::
     LowLevelCallOnce<absl::lts_20250127::base_internal::NumCPUs()::__0>
               (Nonnull<absl::once_flag_*> flag,anon_class_1_0_00000001 *fn)

{
  Nonnull<std::atomic<uint32_t>_*> control;
  uint32_t s;
  atomic<unsigned_int> *once;
  anon_class_1_0_00000001 *fn_local;
  Nonnull<absl::once_flag_*> flag_local;
  memory_order __b;
  
  control = ControlWord(flag);
  std::operator&(memory_order_acquire,__memory_order_mask);
  if ((control->super___atomic_base<unsigned_int>)._M_i != 0xdd) {
    CallOnceImpl<absl::lts_20250127::base_internal::NumCPUs()::__0>(control,SCHEDULE_KERNEL_ONLY,fn)
    ;
  }
  return;
}

Assistant:

void LowLevelCallOnce(absl::Nonnull<absl::once_flag*> flag, Callable&& fn,
                      Args&&... args) {
  std::atomic<uint32_t>* once = base_internal::ControlWord(flag);
  uint32_t s = once->load(std::memory_order_acquire);
  if (ABSL_PREDICT_FALSE(s != base_internal::kOnceDone)) {
    base_internal::CallOnceImpl(once, base_internal::SCHEDULE_KERNEL_ONLY,
                                std::forward<Callable>(fn),
                                std::forward<Args>(args)...);
  }
}